

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
              (void)

{
  basic_string_view<char> bVar1;
  handle hVar2;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  custom_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  custom;
  int value_02;
  type tVar3;
  char *in_stack_00000008;
  undefined2 uStack0000000000000010;
  undefined6 uStack0000000000000012;
  undefined4 in_stack_00000018;
  unsigned_long_long value;
  undefined2 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3a;
  float in_stack_ffffffffffffff3c;
  bool bVar4;
  undefined2 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff42;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  error_handler *this;
  undefined8 in_stack_ffffffffffffff58;
  precision_checker<fmt::v7::detail::error_handler> *this_00;
  precision_checker<fmt::v7::detail::error_handler> local_80;
  error_handler *local_78;
  error_handler local_69;
  char *local_68;
  undefined8 local_60;
  handle local_58;
  basic_string_view<char> local_48;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  precision_checker<fmt::v7::detail::error_handler> *local_10;
  error_handler *local_8;
  
  this_00 = &local_80;
  precision_checker<fmt::v7::detail::error_handler>::precision_checker(this_00,&local_69);
  bVar4 = SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0);
  local_18 = &stack0x00000008;
  local_10 = this_00;
  switch(in_stack_00000018) {
  case 0:
  default:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<fmt::v7::monostate,_0>
                        (this_00);
    break;
  case 1:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<int,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         (int)in_stack_ffffffffffffff3c);
    break;
  case 2:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned_int,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         (uint)in_stack_ffffffffffffff3c);
    break;
  case 3:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<long_long,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         CONCAT44(in_stack_ffffffffffffff3c,
                                  CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)));
    break;
  case 4:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned_long_long,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         CONCAT44(in_stack_ffffffffffffff3c,
                                  CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)));
    break;
  case 5:
    local_28 = in_stack_00000008;
    local_20 = CONCAT62(uStack0000000000000012,uStack0000000000000010);
    value_00._8_8_ = in_stack_ffffffffffffff58;
    value_00._0_8_ = in_stack_ffffffffffffff50;
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<__int128,_0>
                        (this_00,(__int128)value_00);
    break;
  case 6:
    local_38 = in_stack_00000008;
    local_30 = CONCAT62(uStack0000000000000012,uStack0000000000000010);
    value_01._8_8_ = in_stack_ffffffffffffff58;
    value_01._0_8_ = in_stack_ffffffffffffff50;
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<unsigned___int128,_0>
                        (this_00,(unsigned___int128)value_01);
    break;
  case 7:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<bool,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),bVar4);
    break;
  case 8:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<char,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),bVar4);
    break;
  case 9:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<float,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
    break;
  case 10:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<double,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         (double)CONCAT44(in_stack_ffffffffffffff3c,
                                          CONCAT22(in_stack_ffffffffffffff3a,
                                                   in_stack_ffffffffffffff38)));
    break;
  case 0xb:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<long_double,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,uStack0000000000000010),
                         (longdouble)CONCAT28((short)in_stack_00000008,0x273b10));
    break;
  case 0xc:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<const_char_*,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                          CONCAT22(in_stack_ffffffffffffff3a,
                                                   in_stack_ffffffffffffff38)));
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (&local_48,in_stack_00000008,CONCAT62(uStack0000000000000012,uStack0000000000000010));
    bVar1.data_._2_2_ = in_stack_ffffffffffffff3a;
    bVar1.data_._0_2_ = in_stack_ffffffffffffff38;
    bVar1.data_._4_4_ = in_stack_ffffffffffffff3c;
    bVar1.size_._0_2_ = in_stack_ffffffffffffff40;
    bVar1.size_._2_6_ = in_stack_ffffffffffffff42;
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::
              operator()<fmt::v7::basic_string_view<char>,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)0x273b8d,bVar1);
    break;
  case 0xe:
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::operator()<const_void_*,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40),
                         (void *)CONCAT44(in_stack_ffffffffffffff3c,
                                          CONCAT22(in_stack_ffffffffffffff3a,
                                                   in_stack_ffffffffffffff38)));
    break;
  case 0xf:
    local_68 = in_stack_00000008;
    local_60 = CONCAT62(uStack0000000000000012,uStack0000000000000010);
    custom.format._0_2_ = uStack0000000000000010;
    custom.value = in_stack_00000008;
    custom.format._2_6_ = uStack0000000000000012;
    basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::handle::handle(&local_58,custom);
    hVar2.custom_.value._2_2_ = in_stack_ffffffffffffff3a;
    hVar2.custom_.value._0_2_ = in_stack_ffffffffffffff38;
    hVar2.custom_.value._4_4_ = in_stack_ffffffffffffff3c;
    hVar2.custom_.format._0_2_ = in_stack_ffffffffffffff40;
    hVar2.custom_.format._2_6_ = in_stack_ffffffffffffff42;
    local_8 = (error_handler *)
              precision_checker<fmt::v7::detail::error_handler>::
              operator()<fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>::handle,_0>
                        ((precision_checker<fmt::v7::detail::error_handler> *)0x273c0a,hVar2);
  }
  local_78 = local_8;
  this = local_8;
  value_02 = max_value<int>();
  tVar3 = to_unsigned<int>(value_02);
  if (this <= (error_handler *)(ulong)tVar3) {
    return (int)local_78;
  }
  error_handler::on_error(this,in_stack_ffffffffffffff48);
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}